

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall icu_63::DecimalFormat::setPadCharacter(DecimalFormat *this,UnicodeString *padChar)

{
  short sVar1;
  DecimalFormatProperties *pDVar2;
  int len;
  UBool UVar3;
  ushort uVar4;
  UChar32 ch;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  bool bVar8;
  UErrorCode localStatus;
  UnicodeString local_50;
  
  pDVar2 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  uVar4 = (padChar->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar4 & 1) == 0) {
    iVar5 = (int)(short)uVar4 >> 5;
    iVar6 = (padChar->fUnion).fFields.fLength;
    len = iVar5;
    if ((short)uVar4 < 0) {
      len = iVar6;
    }
    sVar1 = (pDVar2->padString).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (pDVar2->padString).fUnion.fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    if ((((int)sVar1 & 1U) != 0) || (len != iVar7)) goto LAB_0024d26f;
    UVar3 = UnicodeString::doEquals(padChar,&pDVar2->padString,len);
    bVar8 = UVar3 != '\0';
  }
  else {
    bVar8 = (bool)(*(byte *)&(pDVar2->padString).fUnion & 1);
  }
  if (bVar8 != false) {
    return;
  }
  uVar4 = (padChar->fUnion).fStackFields.fLengthAndFlags;
  iVar6 = (padChar->fUnion).fFields.fLength;
  iVar5 = (int)(short)uVar4 >> 5;
LAB_0024d26f:
  if ((short)uVar4 < 0) {
    iVar5 = iVar6;
  }
  if (iVar5 < 1) {
    UnicodeString::setToBogus
              (&((this->fields->properties).
                 super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                padString);
  }
  else {
    ch = UnicodeString::char32At(padChar,0);
    UnicodeString::UnicodeString(&local_50,ch);
    UnicodeString::moveFrom
              (&((this->fields->properties).
                 super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                padString,&local_50);
    UnicodeString::~UnicodeString(&local_50);
  }
  local_50.super_Replaceable.super_UObject._vptr_UObject._0_4_ = 0;
  touch(this,(UErrorCode *)&local_50);
  return;
}

Assistant:

void DecimalFormat::setPadCharacter(const UnicodeString& padChar) {
    if (padChar == fields->properties->padString) { return; }
    if (padChar.length() > 0) {
        fields->properties->padString = UnicodeString(padChar.char32At(0));
    } else {
        fields->properties->padString.setToBogus();
    }
    touchNoError();
}